

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

char * nullcDebugGetVmAddressLocation(uint instruction,uint full)

{
  char *pcVar1;
  uint moduleIndex;
  char *sourceLocation;
  ulong uVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  uint *puVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint column;
  OutputContext output;
  long local_280;
  uint local_274;
  OutputContext local_270;
  
  nullcDebugGetVmAddressLocation::buffer.pos = 0;
  local_270.outputBuf = local_270.outputBufDef;
  local_270.outputBufSize = 0x100;
  local_270.outputBufPos = 0;
  local_270.tempBuf = local_270.tempBufDef;
  local_270.tempBufSize = 0x100;
  local_270.openStream = OutputContext::FileOpen;
  local_270.closeStream = OutputContext::FileClose;
  local_270.stream = &nullcDebugGetVmAddressLocation::buffer;
  local_270.writeStream = anon_unknown.dwarf_50af::BufferWriteStream;
  if (NULLC::linker == 0) {
    uVar10 = 0;
    puVar7 = (uint *)0x0;
    local_280 = 0;
  }
  else {
    uVar10 = *(uint *)(NULLC::linker + 0x24c);
    puVar7 = *(uint **)(NULLC::linker + 0x240);
    local_280 = *(long *)(NULLC::linker + 0x290);
  }
  uVar9 = 0;
  if (NULLC::linker == 0) {
    pcVar6 = (char *)0x0;
    lVar4 = 0;
  }
  else {
    pcVar6 = *(char **)(NULLC::linker + 0x2a0);
    uVar9 = *(uint *)(NULLC::linker + 0x28c);
    lVar4 = *(long *)(NULLC::linker + 0x280);
  }
  sourceLocation = nullcDebugGetInstructionSourceLocation(instruction);
  moduleIndex = nullcDebugGetSourceLocationModuleIndex(sourceLocation);
  if (full != 0) {
    if (moduleIndex < uVar9) {
      OutputContext::Printf
                (&local_270,"{%s} ",
                 (ulong)*(uint *)(lVar4 + 4 + (ulong)moduleIndex * 0x1c) + local_280);
    }
    else {
      OutputContext::Printf(&local_270,"{root} ");
    }
  }
  if (uVar10 == 0) {
    puVar7 = (uint *)0x0;
  }
  else {
    uVar2 = (ulong)uVar10;
    do {
      if (((int)puVar7[1] <= (int)instruction) && ((int)instruction < (int)(puVar7[1] + puVar7[2])))
      goto LAB_0010e12a;
      puVar7 = puVar7 + 0x25;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    puVar7 = (uint *)0x0;
  }
LAB_0010e12a:
  if (puVar7 == (uint *)0x0) {
    OutputContext::Print(&local_270,"nullcGlobal()",0xd);
  }
  else {
    OutputContext::Printf(&local_270,"%s(",(ulong)*puVar7 + local_280);
    if (NULLC::linker == 0) {
      lVar4 = 0;
      lVar8 = 0;
    }
    else {
      lVar4 = *(long *)(NULLC::linker + 0x200);
      lVar8 = *(long *)(NULLC::linker + 0x270);
    }
    if (puVar7[0x15] != 0) {
      uVar10 = 0;
      do {
        lVar3 = (ulong)(puVar7[0x14] + uVar10) * 0x1c;
        if (*(char *)(lVar8 + lVar3) == '\0') {
          lVar3 = lVar3 + lVar8;
          pcVar5 = ", ";
          if (uVar10 == 0) {
            pcVar5 = "";
          }
          OutputContext::Printf
                    (&local_270,"%s%s %s",pcVar5,
                     (ulong)*(uint *)(lVar4 + (ulong)*(uint *)(lVar3 + 4) * 0x50) + local_280,
                     (ulong)*(uint *)(lVar3 + 0x18) + local_280);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < puVar7[0x15]);
    }
    OutputContext::Print(&local_270,")",1);
  }
  if (sourceLocation == (char *)0x0) {
    if (local_270.outputBufPos != 0) {
      (*local_270.writeStream)(local_270.stream,local_270.outputBuf,local_270.outputBufPos);
    }
  }
  else {
    local_274 = 0;
    uVar10 = nullcDebugGetSourceLocationLineAndColumn(sourceLocation,moduleIndex,&local_274);
    if (full == 0) {
      OutputContext::Printf(&local_270," Line %d",(ulong)(uVar10 + 1));
    }
    else {
      do {
        pcVar5 = pcVar6;
        if (sourceLocation == pcVar6) break;
        pcVar1 = sourceLocation + -1;
        pcVar5 = sourceLocation;
        sourceLocation = sourceLocation + -1;
      } while (*pcVar1 != '\n');
      for (; (*pcVar5 == '\t' || (*pcVar5 == ' ')); pcVar5 = pcVar5 + 1) {
      }
      lVar4 = 0;
      while ((0xd < (byte)pcVar5[lVar4] || ((0x2401U >> ((byte)pcVar5[lVar4] & 0x1f) & 1) == 0))) {
        lVar4 = lVar4 + 1;
      }
      OutputContext::Printf(&local_270," Line %d at \'%.*s\'",(ulong)(uVar10 + 1),lVar4,pcVar5);
    }
    if (local_270.outputBufPos != 0) {
      (*local_270.writeStream)(local_270.stream,local_270.outputBuf,local_270.outputBufPos);
    }
  }
  local_270._264_8_ = local_270._264_8_ & 0xffffffff;
  local_270.stream = (void *)0x0;
  nullcDebugGetVmAddressLocation::buffer.buf[nullcDebugGetVmAddressLocation::buffer.pos] = '\0';
  OutputContext::~OutputContext(&local_270);
  return nullcDebugGetVmAddressLocation::buffer.buf;
}

Assistant:

const char* nullcDebugGetVmAddressLocation(unsigned instruction, unsigned full)
{
	using namespace NULLC;

	static OutputBuffer buffer;

	// Reset position
	buffer.pos = 0;

	OutputContext output;

	output.stream = &buffer;
	output.writeStream = BufferWriteStream;

	unsigned functionCount = 0;
	ExternFuncInfo *functions = nullcDebugFunctionInfo(&functionCount);

	char *symbols = nullcDebugSymbols(NULL);

	char *fullSource = nullcDebugSource();

	unsigned moduleCount = 0;
	ExternModuleInfo *modules = nullcDebugModuleInfo(&moduleCount);

	const char *sourceLocation = nullcDebugGetInstructionSourceLocation(instruction);

	unsigned moduleIndex = nullcDebugGetSourceLocationModuleIndex(sourceLocation);

	if(full)
	{
		if(moduleIndex < moduleCount)
			output.Printf("{%s} ", symbols + modules[moduleIndex].nameOffset);
		else
			output.Printf("{root} ");
	}

	ExternFuncInfo *targetFunction = nullcDebugConvertAddressToFunction(instruction, functions, functionCount);

	if(targetFunction)
	{
		output.Printf("%s(", symbols + targetFunction->offsetToName);

		unsigned exTypesSize = 0;
		ExternTypeInfo *exTypes = nullcDebugTypeInfo(&exTypesSize);

		unsigned exLocalsSize = 0;
		ExternLocalInfo *exLocals = nullcDebugLocalInfo(&exLocalsSize);

		for(unsigned i = 0; i < targetFunction->paramCount; i++)
		{
			ExternLocalInfo &lInfo = exLocals[targetFunction->offsetToFirstLocal + i];

			if(lInfo.paramType != ExternLocalInfo::PARAMETER)
				continue;

			output.Printf("%s%s %s", i != 0 ? ", " : "", symbols + exTypes[lInfo.type].offsetToName, symbols + lInfo.offsetToName);
		}

		output.Print(")");
	}
	else
	{
		output.Print("nullcGlobal()");
	}

	// Stop if source location is missing
	if(!sourceLocation)
	{
		output.Flush();
		output.stream = NULL;
		buffer.buf[buffer.pos] = 0;

		return buffer.buf;
	}

	const char *codeStart = sourceLocation;

	unsigned column = 0;
	unsigned line = nullcDebugGetSourceLocationLineAndColumn(codeStart, moduleIndex, column);

	if(full)
	{
		// Find beginning of the line
		while(codeStart != fullSource && *(codeStart - 1) != '\n')
			codeStart--;

		// Skip whitespace
		while(*codeStart == ' ' || *codeStart == '\t')
			codeStart++;

		const char *codeEnd = codeStart;

		// Find ending of the line
		while(*codeEnd != '\0' && *codeEnd != '\r' && *codeEnd != '\n')
			codeEnd++;

		int codeLength = int(codeEnd - codeStart);
		output.Printf(" Line %d at '%.*s'", line + 1, codeLength, codeStart);
	}
	else
	{
		output.Printf(" Line %d", line + 1);
	}

	output.Flush();
	output.stream = NULL;
	buffer.buf[buffer.pos] = 0;

	return buffer.buf;
}